

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  uint local_50;
  int fVerbose;
  int c;
  float FlipProb;
  int fDagNodes;
  int fConstSim;
  int fReplaceRare;
  int RareUse;
  int UnseenUse;
  int Reps;
  int Limit;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  UnseenUse = 0;
  RareUse = 1;
  fReplaceRare = 2;
  fConstSim = 2;
  fDagNodes = 0;
  FlipProb = 0.0;
  c = 0;
  fVerbose = 0;
  local_50 = 0;
  Extra_UtilGetoptReset();
LAB_002c903a:
  iVar1 = Extra_UtilGetopt(argc,argv,"LNURPrcdvh");
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Cfs(): There is no AIG.\n");
      return 1;
    }
    Extra_CommandCfs(pAbc->pGia,UnseenUse,RareUse,fReplaceRare,fConstSim,fDagNodes,(int)FlipProb,c,
                     (float)fVerbose,local_50);
    return 0;
  }
  switch(iVar1) {
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_002c932d;
    }
    UnseenUse = atoi(argv[globalUtilOptind]);
    iVar1 = UnseenUse;
    break;
  default:
    goto LAB_002c932d;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_002c932d;
    }
    RareUse = atoi(argv[globalUtilOptind]);
    iVar1 = RareUse;
    break;
  case 0x50:
    if (globalUtilOptind < argc) goto LAB_002c923c;
    Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
    goto LAB_002c932d;
  case 0x52:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
      goto LAB_002c932d;
    }
    fConstSim = atoi(argv[globalUtilOptind]);
    iVar1 = fConstSim;
    break;
  case 0x55:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-U\" should be followed by an integer.\n");
      goto LAB_002c932d;
    }
    fReplaceRare = atoi(argv[globalUtilOptind]);
    iVar1 = fReplaceRare;
    break;
  case 99:
    FlipProb = (float)((uint)FlipProb ^ 1);
    goto LAB_002c903a;
  case 100:
    c = c ^ 1;
    goto LAB_002c903a;
  case 0x68:
    goto LAB_002c932d;
  case 0x72:
    fDagNodes = fDagNodes ^ 1;
    goto LAB_002c903a;
  case 0x76:
    local_50 = local_50 ^ 1;
    goto LAB_002c903a;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar1 < 0) goto LAB_002c932d;
  goto LAB_002c903a;
LAB_002c923c:
  dVar3 = atof(argv[globalUtilOptind]);
  fVerbose = (int)(float)dVar3;
  globalUtilOptind = globalUtilOptind + 1;
  if ((float)fVerbose < 0.0) {
LAB_002c932d:
    Abc_Print(-2,"usage: &cfs [-LNURPrcdvh]\n");
    Abc_Print(-2,"\t          performs simulation\n");
    Abc_Print(-2,"\t-L num  : the limit on the number of occurrences [default = %d]\n",
              (ulong)(uint)UnseenUse);
    Abc_Print(-2,"\t-N num  : the number of repetions of each pattern [default = %d]\n",
              (ulong)(uint)RareUse);
    Abc_Print(-2,"\t-U num  : what to do with unseen patterns [default = %d]\n",
              (ulong)(uint)fReplaceRare);
    Abc_Print(-2,"\t-R num  : what to do with rare patterns [default = %d]\n",(ulong)(uint)fConstSim
             );
    Abc_Print(-2,"\t-P num  : base2-log of ramdom flip probability [default = %f]\n",
              (double)(float)fVerbose);
    pcVar2 = "no";
    if (fDagNodes != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-r      : toggle replacing rare patterns [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (FlipProb != 0.0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-c      : toggle inserting constants [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (c != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-d      : toggle using only DAG nodes [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_50 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h      : print the command usage\n");
    return 1;
  }
  goto LAB_002c903a;
}

Assistant:

int Abc_CommandAbc9Cfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Extra_CommandCfs( Gia_Man_t * pGia, int Limit, int Reps, int UnseenUse, int RareUse, int fReplaceRare, int fConstSim, int fDagNodes, float FlipProb, int fVerbose );
    int Limit       =   0;
    int Reps        =   1;
    int UnseenUse   =   2;
    int RareUse     =   2;
    int fReplaceRare=   0;
    int fConstSim   =   0;
    int fDagNodes   =   0;
    float FlipProb  =   0;
    int c, fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LNURPrcdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            Reps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Reps < 0 )
                goto usage;
            break;
        case 'U':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-U\" should be followed by an integer.\n" );
                goto usage;
            }
            UnseenUse = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( UnseenUse < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            RareUse = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( RareUse < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            FlipProb = atof(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( FlipProb < 0 )
                goto usage;
            break;
        case 'r':
            fReplaceRare ^= 1;
            break;
        case 'c':
            fConstSim ^= 1;
            break;
        case 'd':
            fDagNodes ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cfs(): There is no AIG.\n" );
        return 1;
    }
    Extra_CommandCfs( pAbc->pGia, Limit, Reps, UnseenUse, RareUse, fReplaceRare, fConstSim, fDagNodes, FlipProb, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &cfs [-LNURPrcdvh]\n" );
    Abc_Print( -2, "\t          performs simulation\n" );
    Abc_Print( -2, "\t-L num  : the limit on the number of occurrences [default = %d]\n",  Limit );
    Abc_Print( -2, "\t-N num  : the number of repetions of each pattern [default = %d]\n", Reps );
    Abc_Print( -2, "\t-U num  : what to do with unseen patterns [default = %d]\n",         UnseenUse );
    Abc_Print( -2, "\t-R num  : what to do with rare patterns [default = %d]\n",           RareUse );
    Abc_Print( -2, "\t-P num  : base2-log of ramdom flip probability [default = %f]\n",    FlipProb );
    Abc_Print( -2, "\t-r      : toggle replacing rare patterns [default = %s]\n",          fReplaceRare? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle inserting constants [default = %s]\n",              fConstSim? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle using only DAG nodes [default = %s]\n",             fDagNodes? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n",     fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}